

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O0

void Ssw_ManSetDefaultParams(Ssw_Pars_t *p)

{
  Ssw_Pars_t *p_local;
  
  memset(p,0,0xa8);
  p->nPartSize = 0;
  p->nOverSize = 0;
  p->nFramesK = 1;
  p->nFramesAddSim = 2;
  p->fConstrs = 0;
  p->fMergeFull = 0;
  p->nBTLimit = 1000;
  p->nBTLimitGlobal = 5000000;
  p->nMinDomSize = 100;
  p->nItersStop = -1;
  p->nResimDelta = 1000;
  p->nStepsMax = -1;
  p->fPolarFlip = 0;
  p->fLatchCorr = 0;
  p->fConstCorr = 0;
  p->fOutputCorr = 0;
  p->fSemiFormal = 0;
  p->fDynamic = 0;
  p->fLocalSim = 0;
  p->fVerbose = 0;
  p->fEquivDump = 0;
  p->fLatchCorrOpt = 0;
  p->nSatVarMax = 1000;
  p->nRecycleCalls = 0x32;
  p->nSatVarMax2 = 5000;
  p->nRecycleCalls2 = 0xfa;
  p->nIters = 0;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [This procedure sets default parameters.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManSetDefaultParams( Ssw_Pars_t * p )
{
    memset( p, 0, sizeof(Ssw_Pars_t) );
    p->nPartSize      =       0;  // size of the partition
    p->nOverSize      =       0;  // size of the overlap between partitions
    p->nFramesK       =       1;  // the induction depth
    p->nFramesAddSim  =       2;  // additional frames to simulate
    p->fConstrs       =       0;  // treat the last nConstrs POs as seq constraints
    p->fMergeFull     =       0;  // enables full merge when constraints are used
    p->nBTLimit       =    1000;  // conflict limit at a node
    p->nBTLimitGlobal = 5000000;  // conflict limit for all runs
    p->nMinDomSize    =     100;  // min clock domain considered for optimization
    p->nItersStop     =      -1;  // stop after the given number of iterations
    p->nResimDelta    =    1000;  // the internal of nodes to resimulate
    p->nStepsMax      =      -1;  // (scorr only) the max number of induction steps
    p->fPolarFlip     =       0;  // uses polarity adjustment
    p->fLatchCorr     =       0;  // performs register correspondence
    p->fConstCorr     =       0;  // performs constant correspondence
    p->fOutputCorr    =       0;  // perform 'PO correspondence'
    p->fSemiFormal    =       0;  // enable semiformal filtering
    p->fDynamic       =       0;  // dynamic partitioning
    p->fLocalSim      =       0;  // local simulation
    p->fVerbose       =       0;  // verbose stats
    p->fEquivDump     =       0;  // enables dumping equivalences

    // latch correspondence
    p->fLatchCorrOpt  =       0;  // performs optimized register correspondence
    p->nSatVarMax     =    1000;  // the max number of SAT variables
    p->nRecycleCalls  =      50;  // calls to perform before recycling SAT solver
    // signal correspondence
    p->nSatVarMax2    =    5000;  // the max number of SAT variables
    p->nRecycleCalls2 =     250;  // calls to perform before recycling SAT solver
    // return values
    p->nIters         =       0;  // the number of iterations performed
}